

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

size_t google::protobuf::internal::WireFormatLite::UInt32SizeWithPackedTagSize
                 (RepeatedField<unsigned_int> *value,size_t tag_size,CachedSize *cached_size)

{
  long lVar1;
  bool bVar2;
  int n;
  const_pointer data;
  size_t sVar3;
  ulong uVar4;
  
  bVar2 = RepeatedField<unsigned_int>::empty(value);
  if (bVar2) {
    if (cached_size->atom_ != 0) {
      cached_size->atom_ = 0;
    }
    sVar3 = 0;
  }
  else {
    data = RepeatedField<unsigned_int>::data(value);
    n = RepeatedField<unsigned_int>::size(value);
    sVar3 = VarintSize<false,false,unsigned_int>(data,n);
    cached_size->atom_ = (int)sVar3;
    uVar4 = (long)(int)sVar3 | 1;
    lVar1 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar3 = (ulong)((int)lVar1 * 9 + 0x49U >> 6) + tag_size + sVar3;
  }
  return sVar3;
}

Assistant:

size_t WireFormatLite::UInt32SizeWithPackedTagSize(
    const RepeatedField<uint32_t>& value, size_t tag_size,
    const internal::CachedSize& cached_size) {
  if (value.empty()) {
    cached_size.Set(0);
    return 0;
  }
  size_t res;
  PROTOBUF_ALWAYS_INLINE_CALL res = UInt32Size(value);
  cached_size.SetNonZero(ToCachedSize(res));
  return tag_size + res + Int32Size(static_cast<int32_t>(res));
}